

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

Regexp * re2::Regexp::ConcatOrAlternate
                   (RegexpOp op,Regexp **sub,int nsub,ParseFlags flags,bool can_factor)

{
  Regexp **sub_00;
  Regexp *pRVar1;
  Regexp *pRVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  ulong uVar4;
  uint16_t uVar5;
  Regexp **sub_01;
  uint uVar6;
  int i;
  Regexp **ppRVar7;
  ulong uVar8;
  
  uVar5 = (uint16_t)flags;
  if (nsub == 0) {
    pRVar1 = (Regexp *)operator_new(0x28);
    if (op == kRegexpAlternate) {
      pRVar1->op_ = '\x01';
      pRVar1->simple_ = '\0';
      pRVar1->parse_flags_ = uVar5;
      pRVar1->ref_ = 1;
    }
    else {
      pRVar1->op_ = '\x02';
      pRVar1->simple_ = '\0';
      pRVar1->parse_flags_ = uVar5;
      pRVar1->ref_ = 1;
    }
    *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar1->field_7).field_3.cc_ + 6) = 0;
    *(undefined8 *)&pRVar1->nsub_ = 0;
    *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
    *(undefined2 *)((long)&pRVar1->field_7 + 0xe) = 0;
    return pRVar1;
  }
  if (nsub == 1) {
    return *sub;
  }
  if (can_factor && op == kRegexpAlternate) {
    uVar8 = 0xffffffffffffffff;
    if (-1 < nsub) {
      uVar8 = (long)nsub << 3;
    }
    sub_00 = (Regexp **)operator_new__(uVar8);
    memcpy(sub_00,sub,(long)nsub << 3);
    nsub = FactorAlternation(sub_00,nsub,flags);
    ppRVar7 = sub_00;
    if (nsub == 1) {
      pRVar1 = *sub_00;
      goto LAB_001a8512;
    }
  }
  else {
    sub_00 = sub;
    ppRVar7 = (Regexp **)0x0;
  }
  if (0xffff < nsub) {
    uVar8 = 0;
    uVar6 = (nsub + 0xfffeU) / 0xffff;
    pRVar1 = (Regexp *)operator_new(0x28);
    pRVar1->op_ = (uint8_t)op;
    pRVar1->simple_ = '\0';
    pRVar1->parse_flags_ = uVar5;
    pRVar1->ref_ = 1;
    *(undefined8 *)&pRVar1->nsub_ = 0;
    *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
    *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar1->field_7).field_3.cc_ + 6) = 0;
    *(undefined2 *)((long)&pRVar1->field_7 + 0xe) = 0;
    AllocSub(pRVar1,uVar6);
    if (pRVar1->nsub_ < 2) {
      paVar3 = &pRVar1->field_5;
    }
    else {
      paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar1->field_5).submany_;
    }
    uVar6 = uVar6 - 1;
    sub_01 = sub_00;
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      pRVar2 = ConcatOrAlternate(op,sub_01,0xffff,flags,false);
      paVar3[uVar8].subone_ = pRVar2;
      sub_01 = sub_01 + 0xffff;
    }
    pRVar2 = ConcatOrAlternate(op,sub_00 + uVar6 * 0xffff,nsub + uVar6 * -0xffff,flags,false);
    paVar3[uVar6].subone_ = pRVar2;
    if (ppRVar7 == (Regexp **)0x0) {
      return pRVar1;
    }
    operator_delete__(ppRVar7);
    return pRVar1;
  }
  pRVar1 = (Regexp *)operator_new(0x28);
  pRVar1->op_ = (uint8_t)op;
  pRVar1->simple_ = '\0';
  pRVar1->parse_flags_ = uVar5;
  pRVar1->ref_ = 1;
  *(undefined8 *)&pRVar1->nsub_ = 0;
  *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
  *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
  *(undefined8 *)((long)&(pRVar1->field_7).field_3.cc_ + 6) = 0;
  *(undefined2 *)((long)&pRVar1->field_7 + 0xe) = 0;
  AllocSub(pRVar1,nsub);
  if (pRVar1->nsub_ < 2) {
    paVar3 = &pRVar1->field_5;
  }
  else {
    paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar1->field_5).submany_;
  }
  uVar4 = 0;
  uVar8 = (ulong)(uint)nsub;
  if (nsub < 1) {
    uVar8 = uVar4;
  }
  for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    paVar3[uVar4] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(sub_00 + uVar4);
  }
  if (ppRVar7 == (Regexp **)0x0) {
    return pRVar1;
  }
LAB_001a8512:
  operator_delete__(ppRVar7);
  return pRVar1;
}

Assistant:

Regexp* Regexp::ConcatOrAlternate(RegexpOp op, Regexp** sub, int nsub,
                                  ParseFlags flags, bool can_factor) {
  if (nsub == 1)
    return sub[0];

  if (nsub == 0) {
    if (op == kRegexpAlternate)
      return new Regexp(kRegexpNoMatch, flags);
    else
      return new Regexp(kRegexpEmptyMatch, flags);
  }

  Regexp** subcopy = NULL;
  if (op == kRegexpAlternate && can_factor) {
    // Going to edit sub; make a copy so we don't step on caller.
    subcopy = new Regexp*[nsub];
    memmove(subcopy, sub, nsub * sizeof sub[0]);
    sub = subcopy;
    nsub = FactorAlternation(sub, nsub, flags);
    if (nsub == 1) {
      Regexp* re = sub[0];
      delete[] subcopy;
      return re;
    }
  }

  if (nsub > kMaxNsub) {
    // Too many subexpressions to fit in a single Regexp.
    // Make a two-level tree.  Two levels gets us to 65535^2.
    int nbigsub = (nsub+kMaxNsub-1)/kMaxNsub;
    Regexp* re = new Regexp(op, flags);
    re->AllocSub(nbigsub);
    Regexp** subs = re->sub();
    for (int i = 0; i < nbigsub - 1; i++)
      subs[i] = ConcatOrAlternate(op, sub+i*kMaxNsub, kMaxNsub, flags, false);
    subs[nbigsub - 1] = ConcatOrAlternate(op, sub+(nbigsub-1)*kMaxNsub,
                                          nsub - (nbigsub-1)*kMaxNsub, flags,
                                          false);
    delete[] subcopy;
    return re;
  }

  Regexp* re = new Regexp(op, flags);
  re->AllocSub(nsub);
  Regexp** subs = re->sub();
  for (int i = 0; i < nsub; i++)
    subs[i] = sub[i];

  delete[] subcopy;
  return re;
}